

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall
BBDT<UF>::PerformLabelingMem
          (BBDT<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer piVar10;
  BBDT<UF> *pBVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  uint uVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  double dVar32;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_340 [104];
  Mat local_2d8 [16];
  long local_2c8;
  long *local_290;
  long local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  long *local_258;
  BBDT<UF> *local_250;
  long local_248;
  long local_240;
  long local_238;
  long *local_230;
  long *local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_220;
  long *local_218;
  long local_210;
  long *local_208;
  long local_200;
  pointer local_1f8;
  pointer local_1f0;
  long local_1e8;
  long local_1e0;
  Size local_1d8;
  undefined4 local_1d0;
  Mat *local_1c8;
  undefined8 local_1c0;
  Mat_<int> local_1b8;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = *(uint *)&pMVar6->field_0x8;
  uVar18 = (ulong)uVar13;
  iVar5 = *(int *)&pMVar6->field_0xc;
  lVar27 = (long)iVar5;
  UF::MemAlloc(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) *
               ((int)((uVar13 - ((int)(uVar13 + 1) >> 0x1f)) + 1) >> 1) + 1);
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1d8.height = (int)uVar2;
  local_1d8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_340,&local_1d8,0);
  local_250 = this;
  local_220 = accesses;
  if ((int)uVar13 < 1) {
    uVar13 = UF::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  }
  else {
    uVar31 = 0;
    local_278 = lVar27;
    local_270 = uVar18;
    do {
      if (0 < (int)lVar27) {
        lVar30 = uVar31 - 1;
        lVar29 = uVar31 - 2;
        uVar20 = uVar31 | 1;
        uVar28 = 0;
        do {
          lVar14 = *local_a8;
          lVar22 = lVar14 * uVar31 + local_e0;
          piVar1 = (int *)(lVar22 + uVar28 * 4);
          *piVar1 = *piVar1 + 1;
          lVar19 = *(long *)local_158._80_8_;
          lVar21 = lVar19 * uVar31 + local_158._24_8_;
          if (*(char *)(uVar28 + lVar21) == '\0') {
            if (uVar18 <= uVar20) {
LAB_00191d88:
              uVar23 = uVar28 | 1;
              if ((long)uVar23 < lVar27) {
                piVar1 = (int *)(lVar22 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + uVar23) != '\0') goto LAB_00191da7;
                if ((uVar20 < uVar18) &&
                   (piVar1 = (int *)(local_e0 + lVar14 * uVar20 + uVar23 * 4), *piVar1 = *piVar1 + 1
                   , *(char *)(uVar23 + local_158._24_8_ + lVar19 * uVar20) != '\0'))
                goto LAB_001922b4;
              }
              piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
              uVar13 = 0;
              goto LAB_00192bb8;
            }
            lVar17 = lVar14 * uVar20 + local_e0;
            piVar1 = (int *)(lVar17 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar19 * uVar20 + local_158._24_8_;
            if (*(char *)(uVar28 + lVar24) == '\0') goto LAB_00191d88;
            uVar23 = uVar28 | 1;
            if ((lVar27 <= (long)uVar23) ||
               (piVar1 = (int *)(lVar22 + uVar23 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar21 + uVar23) == '\0')) {
              if ((uVar28 != 0) &&
                 ((piVar1 = (int *)(lVar17 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                  *(char *)(lVar24 + -1 + uVar28) != '\0' ||
                  (piVar1 = (int *)(lVar22 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                  *(char *)(lVar21 + -1 + uVar28) != '\0')))) goto LAB_00192b82;
              goto LAB_001922b4;
            }
            if (uVar28 != 0) {
              piVar1 = (int *)(lVar22 + -4 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + -1 + uVar28) == '\0') {
                piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar24 + -1 + uVar28) == '\0') goto LAB_00191da7;
                if (uVar31 == 0) goto LAB_00192b82;
                lVar24 = lVar14 * lVar30 + local_e0;
                piVar1 = (int *)(lVar24 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar17 = lVar19 * lVar30 + local_158._24_8_;
                if (*(char *)(uVar23 + lVar17) != '\0') {
                  piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar21 + -2 + uVar28) != '\0') {
                    piVar1 = (int *)(lVar24 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar17 + -1 + uVar28) != '\0') {
                      piVar1 = (int *)(lVar24 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar17 + uVar28) == '\0') goto LAB_00191ea0;
                      goto LAB_00192b82;
                    }
                    piVar1 = (int *)(lVar24 + -8 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar17 + -2 + uVar28) != '\0') {
                      lVar14 = local_e0 + lVar14 * lVar29;
                      piVar1 = (int *)(lVar14 + -4 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar19 = local_158._24_8_ + lVar19 * lVar29;
                      if (*(char *)((uVar28 - 1) + lVar19) != '\0') {
                        piVar1 = (int *)(lVar24 + uVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar3 = *(char *)(lVar17 + uVar28);
                        goto joined_r0x00192831;
                      }
                      goto LAB_00192bea;
                    }
                  }
                  goto LAB_00192bce;
                }
                if ((local_278 <= (long)(uVar28 + 2)) ||
                   (piVar1 = (int *)(lVar24 + 8 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar17 + 2 + uVar28) == '\0')) {
                  piVar1 = (int *)(lVar24 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = local_278;
                  if (*(char *)(lVar17 + uVar28) == '\0') goto LAB_00192b82;
                  piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar21 + -2 + uVar28) == '\0') goto LAB_00192bce;
                  piVar1 = (int *)(lVar24 + -4 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00192b82;
                  piVar1 = (int *)(lVar24 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_0019252f;
                }
                lVar14 = local_e0 + lVar14 * lVar29;
                piVar1 = (int *)(lVar14 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = local_158._24_8_ + lVar19 * lVar29;
                if (*(char *)(uVar23 + lVar19) == '\0') {
                  piVar1 = (int *)(lVar24 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = local_278;
                  if (*(char *)(lVar17 + uVar28) == '\0') goto LAB_00192e4d;
                  piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar21 + -2 + uVar28) != '\0') {
                    piVar1 = (int *)(lVar24 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00192e4d;
                    piVar1 = (int *)(lVar24 + -8 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar17 + -2 + uVar28);
joined_r0x00192df0:
                    if (cVar3 != '\0') {
                      piVar1 = (int *)(lVar14 + -4 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *local_290;
                      cVar3 = *(char *)(lVar19 + -1 + uVar28);
                      goto joined_r0x00192a7a;
                    }
                  }
                  lVar27 = *local_290 * lVar29 + local_2c8;
                  piVar1 = (int *)(lVar27 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                  uVar13 = *(uint *)(lVar14 + uVar28 * 4);
LAB_00192ee3:
                  piVar1 = (int *)(lVar27 + 8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar14 + 8 + uVar28 * 4);
                  lVar27 = local_278;
                  goto LAB_00192eed;
                }
                piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = local_278;
                if ((*(char *)(lVar21 + -2 + uVar28) == '\0') ||
                   ((piVar1 = (int *)(lVar24 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                    *(char *)(lVar17 + -1 + uVar28) == '\0' &&
                    ((piVar1 = (int *)(lVar24 + -8 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar17 + -2 + uVar28) == '\0' ||
                     (piVar1 = (int *)(lVar14 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar19 + -1 + uVar28) == '\0')))))) goto LAB_00192e4d;
                piVar1 = (int *)(lVar24 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar17 + uVar28) != '\0') goto LAB_00192b82;
LAB_001923bb:
                piVar1 = (int *)(lVar14 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar19 + uVar28);
                lVar27 = local_278;
LAB_001923c4:
                lVar14 = *local_290;
                if (cVar3 == '\0') {
                  piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + 8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar19 = *(long *)local_340._80_8_;
                  uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + 8 + uVar28 * 4);
                  goto LAB_0019259a;
                }
LAB_00192b99:
                lVar19 = local_2c8 + lVar14 * uVar31;
                piVar1 = (int *)(lVar19 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
                uVar13 = *(uint *)(lVar14 + -8 + uVar28 * 4);
                piVar1 = (int *)(lVar19 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_00192bb8;
              }
              if (uVar31 == 0) goto LAB_00192b82;
              lVar21 = lVar14 * lVar30 + local_e0;
              piVar1 = (int *)(lVar21 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar22 = lVar19 * lVar30 + local_158._24_8_;
              if (*(char *)(uVar23 + lVar22) != '\0') {
                piVar1 = (int *)(lVar21 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + uVar28) != '\0') goto LAB_00192b82;
                lVar17 = local_e0 + lVar14 * lVar29;
                piVar1 = (int *)(lVar17 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = local_158._24_8_ + lVar19 * lVar29;
                if (*(char *)(uVar28 + lVar14) != '\0') {
                  piVar1 = (int *)(lVar21 + -4 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar22 + -1 + uVar28) == '\0') {
                    piVar1 = (int *)(lVar21 + -8 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar22 + -2 + uVar28) != '\0') goto LAB_00191c6e;
                    goto LAB_00192bce;
                  }
                  goto LAB_00192b82;
                }
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_340._80_8_;
                goto LAB_00192c1f;
              }
              if ((lVar27 <= (long)(uVar28 + 2)) ||
                 (piVar1 = (int *)(lVar21 + 8 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar22 + 2 + uVar28) == '\0')) goto LAB_00192b82;
LAB_0019213d:
              lVar17 = local_e0 + lVar14 * lVar29;
              piVar1 = (int *)(lVar17 + (uVar28 | 1) * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = local_158._24_8_ + lVar19 * lVar29;
              if (*(char *)((uVar28 | 1) + lVar14) == '\0') {
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + 8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_340._80_8_;
              }
              else {
                piVar1 = (int *)(lVar21 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + uVar28) != '\0') {
LAB_00192b82:
                  lVar14 = *local_290;
                  goto LAB_00192b99;
                }
                piVar1 = (int *)(lVar17 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar14 + uVar28) != '\0') {
                  piVar1 = (int *)(lVar21 + -4 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar22 + -1 + uVar28) != '\0') goto LAB_00192b82;
                  piVar1 = (int *)(lVar21 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar22 + -2 + uVar28) != '\0') {
                    piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar14 + -1 + uVar28);
                    goto LAB_001923c4;
                  }
                }
LAB_00192e4d:
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + 8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_340._80_8_;
              }
              uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + 8 + uVar28 * 4);
              goto LAB_00192e8f;
            }
LAB_00191da7:
            if (uVar31 == 0) {
LAB_001922b4:
              uVar13 = UF::length_;
              lVar14 = (long)(int)UF::length_;
              UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] =
                   UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14] + 1;
              UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar14] = uVar13;
              uVar13 = UF::length_;
              UF::length_ = UF::length_ + 1;
              goto LAB_001922d9;
            }
            lVar21 = lVar14 * lVar30 + local_e0;
            piVar1 = (int *)(lVar21 + (uVar28 | 1) * 4);
            *piVar1 = *piVar1 + 1;
            lVar22 = lVar19 * lVar30 + local_158._24_8_;
            if (*(char *)((uVar28 | 1) + lVar22) != '\0') {
LAB_0019206c:
              lVar14 = *local_290;
              piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_0019209b;
            }
            if ((lVar27 <= (long)(uVar28 + 2)) ||
               (piVar1 = (int *)(lVar21 + 8 + uVar28 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar22 + 2 + uVar28) == '\0')) {
              piVar1 = (int *)(lVar21 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar22 + uVar28) == '\0') goto LAB_001922b4;
              goto LAB_0019206c;
            }
            piVar1 = (int *)(lVar21 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar22 + uVar28) == '\0') {
LAB_0019262f:
              lVar14 = *local_290;
              piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + 8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_340._80_8_;
              uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + 8 + uVar28 * 4);
              goto LAB_001920ac;
            }
LAB_00191fd9:
            piVar1 = (int *)(local_e0 + lVar14 * lVar29 + (uVar28 | 1) * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *local_290;
            lVar21 = lVar14 * lVar29 + local_2c8;
            if (*(char *)((uVar28 | 1) + local_158._24_8_ + lVar19 * lVar29) == '\0') {
              piVar1 = (int *)(lVar21 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
              uVar13 = *(uint *)(lVar14 + uVar28 * 4);
              piVar1 = (int *)(lVar21 + 8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar14 + 8 + uVar28 * 4);
              goto LAB_00192ea7;
            }
            piVar1 = (int *)(lVar21 + 8 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)local_340._80_8_;
            uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + 8 + uVar28 * 4);
            piVar1 = (int *)(local_2c8 + lVar14 * uVar31 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
LAB_001920b7:
            lVar14 = lVar19 * uVar31 + local_340._24_8_;
          }
          else {
            if (uVar28 == 0) {
LAB_00191ec1:
              uVar23 = uVar28 | 1;
              if (lVar27 <= (long)uVar23) {
LAB_00192045:
                if (uVar31 != 0) {
                  lVar21 = local_e0 + lVar14 * lVar30;
                  piVar1 = (int *)(lVar21 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = local_158._24_8_ + lVar19 * lVar30;
                  if (*(char *)(uVar28 + lVar14) == '\0') {
                    if (uVar28 != 0) goto LAB_0019220c;
                    goto LAB_001922b4;
                  }
                  goto LAB_0019206c;
                }
                goto LAB_001922b4;
              }
              if (uVar31 == 0) {
LAB_00191f7e:
                piVar1 = (int *)(lVar22 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + uVar23) == '\0') goto LAB_00192045;
                if ((long)(uVar28 + 2) < lVar27) {
                  if (uVar31 == 0) goto LAB_001922b4;
                  lVar21 = local_e0 + lVar14 * lVar30;
                  piVar1 = (int *)(lVar21 + 8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = local_158._24_8_ + lVar19 * lVar30;
                  if (*(char *)(uVar28 + 2 + lVar22) == '\0') goto LAB_00192277;
                  piVar1 = (int *)(lVar21 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar22 + uVar28) == '\0') {
                    if ((uVar28 != 0) &&
                       (piVar1 = (int *)(lVar21 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                       *(char *)(lVar22 + -1 + uVar28) != '\0')) {
                      lVar21 = local_e0 + lVar14 * lVar29;
                      piVar1 = (int *)(lVar21 + uVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = local_158._24_8_ + lVar19 * lVar29;
                      if (*(char *)(uVar23 + lVar14) == '\0') {
                        lVar19 = *local_290 * lVar29 + local_2c8;
                        piVar1 = (int *)(lVar19 + -8 + uVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar14 = *(long *)local_340._80_8_;
                      }
                      else {
                        piVar1 = (int *)(lVar21 + uVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar14 + uVar28) != '\0') goto LAB_0019262f;
                        lVar19 = *local_290 * lVar29 + local_2c8;
                        piVar1 = (int *)(lVar19 + -8 + uVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar14 = *(long *)local_340._80_8_;
                      }
                      lVar14 = lVar14 * lVar29 + local_340._24_8_;
                      uVar13 = *(uint *)(lVar14 + -8 + uVar28 * 4);
                      piVar1 = (int *)(lVar19 + 8 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(uint *)(lVar14 + 8 + uVar28 * 4);
                      goto LAB_00192ea7;
                    }
                    goto LAB_0019262f;
                  }
                  goto LAB_00191fd9;
                }
                if (uVar31 == 0) goto LAB_001922b4;
LAB_00192277:
                lVar21 = local_e0 + lVar14 * lVar30;
                piVar1 = (int *)(lVar21 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = local_158._24_8_ + lVar19 * lVar30;
                if (*(char *)(uVar28 + lVar14) != '\0') goto LAB_0019206c;
                if (uVar31 == 0 || uVar28 == 0) goto LAB_001922b4;
LAB_0019220c:
                piVar1 = (int *)(lVar21 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar14 + -1 + uVar28) == '\0') goto LAB_001922b4;
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + -8 + uVar28 * 4);
              }
              else {
                lVar17 = lVar14 * lVar30 + local_e0;
                piVar1 = (int *)(lVar17 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = lVar19 * lVar30 + local_158._24_8_;
                if (*(char *)(uVar23 + lVar24) == '\0') goto LAB_00191f7e;
                piVar1 = (int *)(lVar17 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (((*(char *)(lVar24 + uVar28) != '\0') || (uVar28 == 0)) ||
                   (piVar1 = (int *)(lVar17 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar24 + -1 + uVar28) == '\0')) goto LAB_0019206c;
                piVar1 = (int *)(local_e0 + lVar14 * lVar29 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(uVar28 + local_158._24_8_ + lVar19 * lVar29) == '\0') {
                  lVar14 = *local_290 * lVar29 + local_2c8;
                  piVar1 = (int *)(lVar14 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar19 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                  uVar13 = *(uint *)(lVar19 + -8 + uVar28 * 4);
                  piVar1 = (int *)(lVar14 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar19 + uVar28 * 4);
                  goto LAB_00192ea7;
                }
                lVar14 = *local_290;
                piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
LAB_0019209b:
                lVar19 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + uVar28 * 4);
              }
LAB_001920ac:
              piVar1 = (int *)(lVar14 * uVar31 + local_2c8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001920b7;
            }
            piVar1 = (int *)(lVar22 + -4 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + -1 + uVar28) != '\0') {
              uVar23 = uVar28 | 1;
              if (lVar27 <= (long)uVar23) goto LAB_00192b82;
              if (uVar31 == 0) {
LAB_001920f3:
                piVar1 = (int *)(lVar22 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                if (((*(char *)(lVar21 + uVar23) != '\0') && (uVar31 != 0)) &&
                   ((long)(uVar28 + 2) < lVar27)) {
                  lVar21 = lVar14 * lVar30 + local_e0;
                  piVar1 = (int *)(lVar21 + 8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar22 = lVar19 * lVar30 + local_158._24_8_;
                  if (*(char *)(uVar28 + 2 + lVar22) != '\0') goto LAB_0019213d;
                }
                goto LAB_00192b82;
              }
              lVar24 = lVar14 * lVar30 + local_e0;
              piVar1 = (int *)(lVar24 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = lVar19 * lVar30 + local_158._24_8_;
              if (*(char *)(uVar23 + lVar25) == '\0') goto LAB_001920f3;
              piVar1 = (int *)(lVar24 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar25 + uVar28) != '\0') goto LAB_00192b82;
              lVar17 = local_e0 + lVar14 * lVar29;
              piVar1 = (int *)(lVar17 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = local_158._24_8_ + lVar19 * lVar29;
              if (*(char *)(uVar28 + lVar14) != '\0') {
                piVar1 = (int *)(lVar24 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar25 + -1 + uVar28) != '\0') goto LAB_00192b82;
                piVar1 = (int *)(lVar24 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar25 + -2 + uVar28) == '\0') goto LAB_00192bce;
LAB_00191c6e:
                piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar14 + -1 + uVar28);
LAB_00191c79:
                lVar14 = *local_290;
joined_r0x0019256b:
                if (cVar3 == '\0') {
                  piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar19 = *(long *)local_340._80_8_;
                  uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + uVar28 * 4);
                  goto LAB_0019259a;
                }
                goto LAB_00192b99;
              }
LAB_00192bea:
              lVar14 = *local_290;
LAB_00192c00:
              piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_340._80_8_;
LAB_00192c1f:
              uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + uVar28 * 4);
LAB_00192e8f:
              piVar1 = (int *)(lVar14 * uVar31 + local_2c8 + -8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = lVar19 * uVar31 + local_340._24_8_;
              goto LAB_00192ea2;
            }
            if ((uVar18 <= uVar20) ||
               (piVar1 = (int *)(lVar14 * uVar20 + local_e0 + -4 + uVar28 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)((uVar28 - 1) + lVar19 * uVar20 + local_158._24_8_) == '\0'))
            goto LAB_00191ec1;
            uVar23 = uVar28 | 1;
            if ((long)uVar23 < lVar27) {
              if (uVar31 != 0) {
                lVar17 = lVar14 * lVar30 + local_e0;
                piVar1 = (int *)(lVar17 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = lVar19 * lVar30 + local_158._24_8_;
                if (*(char *)(uVar23 + lVar24) == '\0') goto LAB_0019230a;
                piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar28) != '\0') {
                  piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar24 + -1 + uVar28) != '\0') {
                    piVar1 = (int *)(lVar17 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar24 + uVar28) != '\0') goto LAB_00192b82;
LAB_00191ea0:
                    piVar1 = (int *)(local_e0 + lVar14 * lVar29 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(uVar28 + local_158._24_8_ + lVar19 * lVar29);
LAB_00192558:
                    lVar14 = *local_290;
                    goto joined_r0x0019256b;
                  }
                  piVar1 = (int *)(lVar17 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar24 + -2 + uVar28) == '\0') goto LAB_00192bce;
                  lVar14 = local_e0 + lVar14 * lVar29;
                  piVar1 = (int *)(lVar14 + -4 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar19 = local_158._24_8_ + lVar19 * lVar29;
                  if (*(char *)((uVar28 - 1) + lVar19) == '\0') goto LAB_00192bea;
                  piVar1 = (int *)(lVar17 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar3 = *(char *)(lVar24 + uVar28);
joined_r0x00192831:
                  if (cVar3 == '\0') {
                    piVar1 = (int *)(lVar14 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar19 + uVar28);
                    goto LAB_00191c79;
                  }
                  goto LAB_00192b82;
                }
                piVar1 = (int *)(lVar17 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if ((*(char *)(lVar24 + uVar28) != '\0') ||
                   (piVar1 = (int *)(lVar17 + -4 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar24 + -1 + uVar28) == '\0')) goto LAB_00192bce;
                piVar1 = (int *)(local_e0 + lVar14 * lVar29 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = *local_290;
                lVar21 = lVar14 * lVar29 + local_2c8;
                if (*(char *)(uVar28 + local_158._24_8_ + lVar19 * lVar29) == '\0') {
                  piVar1 = (int *)(lVar21 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                  uVar13 = *(uint *)(lVar14 + -8 + uVar28 * 4);
                  piVar1 = (int *)(lVar21 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar14 + uVar28 * 4);
LAB_00192eed:
                  uVar13 = UF::MemMerge(uVar13,uVar16);
                  piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(*(long *)local_340._80_8_ * uVar31 + local_340._24_8_ + -8 +
                                    uVar28 * 4);
                  goto LAB_00192ea7;
                }
                piVar1 = (int *)(lVar21 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_340._80_8_;
                uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + uVar28 * 4);
LAB_00192aa1:
                piVar1 = (int *)(local_2c8 + lVar14 * uVar31 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = lVar19 * uVar31 + local_340._24_8_;
                goto LAB_00192ea2;
              }
LAB_0019230a:
              piVar1 = (int *)(lVar22 + uVar23 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + uVar23) == '\0') goto LAB_00192411;
              uVar18 = local_270;
              if (lVar27 <= (long)(uVar28 + 2)) {
                if (uVar31 == 0) goto LAB_001928be;
LAB_001926b5:
                lVar17 = lVar14 * lVar30 + local_e0;
                piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = lVar19 * lVar30 + local_158._24_8_;
                if (*(char *)((uVar28 - 1) + lVar27) == '\0') {
                  piVar1 = (int *)(lVar17 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar27 + uVar28) == '\0') goto LAB_001928be;
                  piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(lVar21 + -2 + uVar28) != '\0') &&
                     (piVar1 = (int *)(lVar17 + -8 + uVar28 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar27 + -2 + uVar28) != '\0')) {
                    piVar1 = (int *)(local_e0 + lVar14 * lVar29 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)((uVar28 - 1) + local_158._24_8_ + lVar19 * lVar29);
                    lVar14 = *local_290;
                    lVar27 = local_278;
                    goto joined_r0x0019256b;
                  }
                  lVar27 = *local_290;
                  piVar1 = (int *)(lVar27 * lVar29 + local_2c8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_;
                  uVar13 = *(uint *)(lVar14 * lVar29 + local_340._24_8_ + uVar28 * 4);
                  piVar1 = (int *)(lVar27 * uVar31 + local_2c8 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = UF::MemMerge(uVar13,*(uint *)(lVar14 * uVar31 + local_340._24_8_ + -8 +
                                                        uVar28 * 4));
                  piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
                  uVar18 = local_270;
                  lVar27 = local_278;
                  goto LAB_00192bb8;
                }
                piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar21 + -2 + uVar28);
                lVar14 = *local_290;
                lVar27 = local_278;
                goto joined_r0x0019245d;
              }
              if (uVar31 != 0) {
                lVar17 = local_e0 + lVar14 * lVar30;
                piVar1 = (int *)(lVar17 + 8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = local_158._24_8_ + lVar19 * lVar30;
                if (*(char *)(uVar28 + 2 + lVar24) == '\0') goto LAB_001926b5;
                piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar28) == '\0') {
                  piVar1 = (int *)(lVar17 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar24 + uVar28) == '\0') {
                    piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar24 + -1 + uVar28) == '\0') goto LAB_00192e4d;
                    lVar14 = local_e0 + lVar14 * lVar29;
                    piVar1 = (int *)(lVar14 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_158._24_8_ + lVar19 * lVar29;
                    if (*(char *)(uVar23 + lVar27) == '\0') {
                      lVar27 = *local_290 * lVar29 + local_2c8;
                      piVar1 = (int *)(lVar27 + -8 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar14 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                      uVar13 = *(uint *)(lVar14 + -8 + uVar28 * 4);
                      goto LAB_00192ee3;
                    }
                    piVar1 = (int *)(lVar14 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *local_290;
                    lVar19 = lVar14 * lVar29 + local_2c8;
                    if (*(char *)(lVar27 + uVar28) != '\0') goto LAB_00192a80;
                    piVar1 = (int *)(lVar19 + -8 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                    uVar13 = *(uint *)(lVar27 + -8 + uVar28 * 4);
                  }
                  else {
                    piVar1 = (int *)(local_e0 + lVar14 * lVar29 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *local_290;
                    cVar3 = *(char *)(uVar23 + local_158._24_8_ + lVar19 * lVar29);
joined_r0x00192a7a:
                    lVar19 = lVar14 * lVar29 + local_2c8;
                    if (cVar3 != '\0') {
LAB_00192a80:
                      piVar1 = (int *)(lVar19 + 8 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar19 = *(long *)local_340._80_8_;
                      uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + 8 + uVar28 * 4);
                      lVar27 = local_278;
                      goto LAB_00192aa1;
                    }
                    piVar1 = (int *)(lVar19 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = *(long *)local_340._80_8_ * lVar29 + local_340._24_8_;
                    uVar13 = *(uint *)(lVar27 + uVar28 * 4);
                  }
                  piVar1 = (int *)(lVar19 + 8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar27 + 8 + uVar28 * 4);
                  lVar27 = local_278;
                  goto LAB_00192eed;
                }
                piVar1 = (int *)(lVar17 + -4 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar24 + -1 + uVar28);
                lVar14 = local_e0 + lVar14 * lVar29;
                piVar1 = (int *)(lVar14 + uVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = local_158._24_8_ + lVar19 * lVar29;
                cVar4 = *(char *)(uVar23 + lVar19);
                if (cVar3 == '\0') {
                  if (cVar4 == '\0') {
                    piVar1 = (int *)(lVar17 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar24 + uVar28) != '\0') {
                      piVar1 = (int *)(lVar17 + -8 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar3 = *(char *)(lVar24 + -2 + uVar28);
                      goto joined_r0x00192df0;
                    }
                  }
                  else {
                    piVar1 = (int *)(lVar17 + -8 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar27 = local_278;
                    if (*(char *)(lVar24 + -2 + uVar28) != '\0') {
                      piVar1 = (int *)(lVar14 + -4 + uVar28 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar4 = *(char *)(lVar19 + -1 + uVar28);
                      goto joined_r0x00192c94;
                    }
                  }
                }
                else {
joined_r0x00192c94:
                  lVar27 = local_278;
                  if (cVar4 != '\0') {
                    piVar1 = (int *)(lVar17 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar24 + uVar28) == '\0') goto LAB_001923bb;
                    goto LAB_00192b82;
                  }
                }
                goto LAB_00192e4d;
              }
LAB_001928be:
              lVar27 = *local_290 * uVar31 + local_2c8;
              piVar1 = (int *)(lVar27 + -8 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
              uVar13 = *(uint *)(lVar14 + -8 + uVar28 * 4);
              piVar1 = (int *)(lVar27 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = local_278;
              goto LAB_00192bb8;
            }
LAB_00192411:
            if (uVar31 == 0) goto LAB_00192b82;
            lVar24 = lVar14 * lVar30 + local_e0;
            piVar1 = (int *)(lVar24 + -4 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar17 = lVar19 * lVar30 + local_158._24_8_;
            if (*(char *)((uVar28 - 1) + lVar17) == '\0') {
              piVar1 = (int *)(lVar24 + uVar28 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar17 + uVar28) != '\0') {
                piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar28) != '\0') {
                  piVar1 = (int *)(lVar24 + -8 + uVar28 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_0019252f:
                  if (*(char *)(lVar17 + -2 + uVar28) != '\0') {
                    piVar1 = (int *)(local_e0 + lVar14 * lVar29 + -4 + uVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)((uVar28 - 1) + local_158._24_8_ + lVar19 * lVar29);
                    goto LAB_00192558;
                  }
                }
LAB_00192bce:
                lVar14 = *local_290;
                goto LAB_00192c00;
              }
              goto LAB_00192b82;
            }
            piVar1 = (int *)(lVar22 + -8 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar21 + -2 + uVar28);
            lVar14 = *local_290;
joined_r0x0019245d:
            if (cVar3 != '\0') goto LAB_00192b99;
            piVar1 = (int *)(lVar14 * lVar29 + local_2c8 + -8 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)local_340._80_8_;
            uVar13 = *(uint *)(lVar19 * lVar29 + local_340._24_8_ + -8 + uVar28 * 4);
LAB_0019259a:
            piVar1 = (int *)(lVar14 * uVar31 + local_2c8 + -8 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = lVar19 * uVar31 + local_340._24_8_;
LAB_00192ea2:
            uVar16 = *(uint *)(lVar14 + -8 + uVar28 * 4);
LAB_00192ea7:
            uVar13 = UF::MemMerge(uVar13,uVar16);
LAB_001922d9:
            piVar1 = (int *)(*local_290 * uVar31 + local_2c8 + uVar28 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)local_340._80_8_ * uVar31 + local_340._24_8_;
          }
LAB_00192bb8:
          *(uint *)(lVar14 + uVar28 * 4) = uVar13;
          uVar28 = uVar28 + 2;
        } while ((long)uVar28 < lVar27);
      }
      uVar31 = uVar31 + 2;
    } while (uVar31 < uVar18);
    uVar13 = UF::MemFlatten();
    (local_250->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
    if (0 < (int)uVar18) {
      local_200 = local_2c8;
      local_208 = local_290;
      local_210 = local_340._24_8_;
      local_218 = (long *)local_340._80_8_;
      lVar30 = 1;
      local_268 = 0;
      do {
        piVar10 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar9 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)lVar27) {
          local_258 = (long *)local_340._80_8_;
          local_260 = local_268 | 1;
          local_1f0 = UF::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_1f8 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_228 = local_a8;
          local_230 = (long *)local_158._80_8_;
          local_1e0 = *local_290 * local_268 + local_2c8;
          local_1e8 = *(long *)local_340._80_8_ * local_268 + local_340._24_8_;
          local_240 = local_e0;
          local_248 = local_158._24_8_;
          lVar29 = 1;
          do {
            piVar1 = (int *)(local_1e0 + -4 + lVar29 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = (long)*(int *)(local_1e8 + -4 + lVar29 * 4);
            if (lVar14 < 1) {
              lVar14 = *local_290;
              lVar21 = local_268 * lVar14 + local_2c8;
              piVar1 = (int *)(lVar21 + -4 + lVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_340._80_8_;
              lVar22 = local_268 * lVar19 + local_340._24_8_;
              *(undefined4 *)(lVar22 + -4 + lVar29 * 4) = 0;
              if (lVar29 < lVar27) {
                piVar1 = (int *)(lVar21 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar22 + lVar29 * 4) = 0;
                if (local_260 < uVar18) {
                  lVar27 = lVar14 * lVar30 + local_2c8;
                  piVar1 = (int *)(lVar27 + -4 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar14 = lVar19 * lVar30 + local_340._24_8_;
                  *(undefined4 *)(lVar14 + -4 + lVar29 * 4) = 0;
                  piVar1 = (int *)(lVar27 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar14 + lVar29 * 4) = 0;
                }
              }
              else if (local_260 < uVar18) {
                piVar1 = (int *)(lVar14 * lVar30 + local_2c8 + -4 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar19 * lVar30 + local_340._24_8_ + -4 + lVar29 * 4) = 0;
              }
            }
            else {
              piVar10[lVar14] = piVar10[lVar14] + 1;
              uVar13 = puVar9[lVar14];
              lVar14 = *local_a8;
              lVar24 = local_268 * lVar14 + local_e0;
              piVar1 = (int *)(lVar24 + -4 + lVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_158._80_8_;
              lVar17 = local_268 * lVar19 + local_158._24_8_;
              lVar21 = *local_290;
              lVar22 = local_268 * lVar21 + local_2c8;
              uVar16 = uVar13;
              if (*(char *)(lVar29 + -1 + lVar17) == '\0') {
                uVar16 = 0;
              }
              piVar1 = (int *)(lVar22 + -4 + lVar29 * 4);
              *piVar1 = *piVar1 + 1;
              lVar25 = *(long *)local_340._80_8_;
              lVar26 = local_268 * lVar25 + local_340._24_8_;
              *(uint *)(lVar26 + -4 + lVar29 * 4) = uVar16;
              uVar18 = local_270;
              if (lVar29 < lVar27) {
                piVar1 = (int *)(lVar24 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = uVar13;
                if (*(char *)(lVar29 + lVar17) == '\0') {
                  uVar16 = 0;
                }
                piVar1 = (int *)(lVar22 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar26 + lVar29 * 4) = uVar16;
                if (local_260 < local_270) {
                  piVar1 = (int *)(lVar14 * lVar30 + local_e0 + -4 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = uVar13;
                  if (*(char *)(lVar29 + -1 + lVar19 * lVar30 + local_158._24_8_) == '\0') {
                    lVar21 = *local_290;
                    uVar16 = 0;
                  }
                  piVar1 = (int *)(lVar21 * lVar30 + local_2c8 + -4 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + -4 + lVar29 * 4)
                       = uVar16;
                  piVar1 = (int *)(*local_a8 * lVar30 + local_e0 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar29 + *(long *)local_158._80_8_ * lVar30 + local_158._24_8_) ==
                      '\0') {
                    piVar1 = (int *)(*local_290 * lVar30 + local_2c8 + lVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)
                     (*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + lVar29 * 4) = 0;
                  }
                  else {
                    piVar1 = (int *)(*local_290 * lVar30 + local_2c8 + lVar29 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_340._80_8_ * lVar30 + local_340._24_8_ + lVar29 * 4) =
                         uVar13;
                  }
                }
              }
              else if (local_260 < local_270) {
                piVar1 = (int *)(lVar14 * lVar30 + local_e0 + -4 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar29 + -1 + lVar19 * lVar30 + local_158._24_8_);
                piVar1 = (int *)(lVar21 * lVar30 + local_2c8 + -4 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = lVar25 * lVar30 + local_340._24_8_;
                if (cVar3 == '\0') {
                  *(undefined4 *)(lVar27 + -4 + lVar29 * 4) = 0;
                }
                else {
                  *(uint *)(lVar27 + -4 + lVar29 * 4) = uVar13;
                }
              }
            }
            lVar14 = lVar29 + 1;
            lVar27 = local_278;
            lVar29 = lVar29 + 2;
            local_238 = lVar30;
          } while (lVar14 < local_278);
        }
        local_268 = local_268 + 2;
        lVar30 = lVar30 + 2;
      } while (local_268 < uVar18);
    }
  }
  pauVar15 = (undefined1 (*) [16])operator_new(0x20);
  pvVar12 = local_220;
  pBVar11 = local_250;
  pauVar15[1] = (undefined1  [16])0x0;
  *pauVar15 = (undefined1  [16])0x0;
  puVar7 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar15;
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar15 + 2);
  (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar15 + 2);
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)puVar8 - (long)puVar7);
  }
  local_1c0 = 0;
  local_1d0 = 0x81010004;
  local_1c8 = local_f0;
  cv::sum((_InputArray *)&local_1b8);
  *(pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_1b8._0_8_ - 9.223372036854776e+18) &
       (long)(double)local_1b8._0_8_ >> 0x3f | (long)(double)local_1b8._0_8_;
  local_1c0 = 0;
  local_1d0 = 0x81010004;
  local_1c8 = local_2d8;
  cv::sum((_InputArray *)&local_1b8);
  puVar7 = (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7[1] = (long)((double)local_1b8._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_1b8._0_8_ >> 0x3f | (long)(double)local_1b8._0_8_;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar18 = 0;
  }
  else {
    lVar27 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar32 = 0.0;
    lVar30 = 0;
    do {
      dVar32 = dVar32 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar30];
      lVar30 = lVar30 + 1;
    } while (lVar27 + (ulong)(lVar27 == 0) != lVar30);
    uVar18 = (long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32;
  }
  puVar7[2] = uVar18;
  MemMat<int>::GetImage(&local_1b8,(MemMat<int> *)local_340);
  cv::Mat::operator=(&((pBVar11->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,&local_1b8.super_Mat);
  cv::Mat::~Mat(&local_1b8.super_Mat);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat((Mat *)(local_340 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img(r-2, c-1)>0
#define CONDITION_C r-2>=0 && img(r-2, c)>0
#define CONDITION_D c+1<w && r-2>=0 && img(r-2, c+1)>0
#define CONDITION_E c+2<w && r-2>=0 && img(r-2, c+2)>0

#define CONDITION_G c-2>=0 && r-1>=0 && img(r-1, c-2)>0
#define CONDITION_H c-1>=0 && r-1>=0 && img(r-1, c-1)>0
#define CONDITION_I r-1>=0 && img(r-1, c)>0
#define CONDITION_J c+1<w && r-1>=0 && img(r-1, c+1)>0
#define CONDITION_K c+2<w && r-1>=0 && img(r-1, c+2)>0

#define CONDITION_M c-2>=0 && img(r, c-2)>0
#define CONDITION_N c-1>=0 && img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P c+1<w && img(r,c+1)>0

#define CONDITION_R c-1>=0 && r+1<h && img(r+1, c-1)>0
#define CONDITION_S r+1<h && img(r+1, c)>0
#define CONDITION_T c+1<w && r+1<h && img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2); continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c); continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2); continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2)); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2)); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2)); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2)); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }